

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O3

sexp_conflict sexp_twos_complement(sexp_conflict ctx,sexp_conflict x)

{
  sexp_conflict res;
  sexp_conflict local_30;
  sexp_gc_var_t local_28;
  
  local_30 = (sexp_conflict)0x43e;
  if (((((ulong)x & 3) == 0) && (x->tag == 0xc)) && ((x->value).flonum_bits[0] < '\0')) {
    local_28.var = &local_30;
    local_28.next = (ctx->value).context.saves;
    (ctx->value).context.saves = &local_28;
    local_30 = (sexp_conflict)sexp_copy_bignum(ctx,0,x,0);
    sexp_set_twos_complement(local_30);
    (ctx->value).context.saves = local_28.next;
    x = local_30;
  }
  return x;
}

Assistant:

static sexp sexp_twos_complement (sexp ctx, sexp x) {
  sexp_gc_var1(res);
  if (sexp_bignump(x) && sexp_bignum_sign(x) < 0) {
    sexp_gc_preserve1(ctx, res);
    res = sexp_copy_bignum(ctx, NULL, x, 0);
    sexp_set_twos_complement(res);
    sexp_gc_release1(ctx);
    return res;
  }
  return x;
}